

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestReadCustomFilesCommand.h
# Opt level: O0

void __thiscall
cmCTestReadCustomFilesCommand::~cmCTestReadCustomFilesCommand(cmCTestReadCustomFilesCommand *this)

{
  cmCTestReadCustomFilesCommand *this_local;
  
  ~cmCTestReadCustomFilesCommand(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

cmCTestReadCustomFilesCommand() {}